

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# core.h
# Opt level: O1

int fmt::v10::detail::parse_nonnegative_int<char>(char **begin,char *end,int error_value)

{
  char *pcVar1;
  char *pcVar2;
  uint uVar3;
  ulong uVar4;
  char *pcVar5;
  char *pcVar6;
  
  pcVar2 = *begin;
  if ((pcVar2 == end) || (9 < (byte)(*pcVar2 - 0x30U))) {
    assert_fail("/workspace/llm4binary/github/license_all_cmakelists_25/evaikene[P]filefind/fmt/core.h"
                ,0x85e,"");
  }
  uVar3 = 0;
  pcVar1 = pcVar2;
  do {
    pcVar5 = pcVar1;
    uVar4 = (ulong)uVar3;
    uVar3 = ((int)*pcVar5 + uVar3 * 10) - 0x30;
    pcVar1 = pcVar5 + 1;
    pcVar6 = end;
    if (pcVar1 == end) break;
    pcVar6 = pcVar1;
  } while ((byte)(*pcVar1 - 0x30U) < 10);
  *begin = pcVar6;
  if ((9 < (long)pcVar6 - (long)pcVar2) &&
     (((long)pcVar6 - (long)pcVar2 != 10 ||
      (((ulong)((int)*pcVar5 - 0x30U & 0xfffffffe) + uVar4 * 10 & 0xffffffff80000000) != 0)))) {
    uVar3 = error_value;
  }
  return uVar3;
}

Assistant:

FMT_CONSTEXPR auto parse_nonnegative_int(const Char*& begin, const Char* end,
                                         int error_value) noexcept -> int {
  FMT_ASSERT(begin != end && '0' <= *begin && *begin <= '9', "");
  unsigned value = 0, prev = 0;
  auto p = begin;
  do {
    prev = value;
    value = value * 10 + unsigned(*p - '0');
    ++p;
  } while (p != end && '0' <= *p && *p <= '9');
  auto num_digits = p - begin;
  begin = p;
  if (num_digits <= std::numeric_limits<int>::digits10)
    return static_cast<int>(value);
  // Check for overflow.
  const unsigned max = to_unsigned((std::numeric_limits<int>::max)());
  return num_digits == std::numeric_limits<int>::digits10 + 1 &&
                 prev * 10ull + unsigned(p[-1] - '0') <= max
             ? static_cast<int>(value)
             : error_value;
}